

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool __thiscall
(anonymous_namespace)::ExprComparator::
VisitBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
          (ExprComparator *this,
          BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
          e)

{
  Expr e_00;
  bool bVar1;
  ExprBase e2;
  ExprBase other;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> BVar2;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  binary;
  uint7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar3;
  undefined8 in_stack_ffffffffffffffa0;
  type tVar4;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_ffffffffffffffa8;
  ExprBase in_stack_ffffffffffffffb0;
  ExprBase in_stack_ffffffffffffffd8;
  
  tVar4 = (type)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  e_00.super_ExprBase.impl_._7_1_ = in_stack_ffffffffffffff9f;
  e_00.super_ExprBase.impl_._0_7_ = in_stack_ffffffffffffff98;
  mp::
  Cast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            (e_00);
  e2.impl_ = (Impl *)mp::
                     BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                     ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                            *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_ffffffffffffffa8,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffffb0.impl_,tVar4
            );
  mp::
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
         *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_ffffffffffffffa8,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_ffffffffffffffb0.impl_,tVar4
            );
  bVar1 = mp::Equal((Expr)in_stack_ffffffffffffffd8.impl_,(Expr)e2.impl_);
  uVar3 = false;
  if (bVar1) {
    other.impl_ = (Impl *)mp::
                          BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                          ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                                 *)(ulong)in_stack_ffffffffffffff98);
    mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              (in_stack_ffffffffffffffa8,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)other.impl_,tVar4);
    BVar2 = mp::
            BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
            ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                   *)CONCAT17(uVar3,in_stack_ffffffffffffff98));
    mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
              (in_stack_ffffffffffffffa8,
               (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)other.impl_,
               BVar2.super_ExprBase.impl_._4_4_);
    uVar3 = mp::Equal((Expr)in_stack_ffffffffffffffd8.impl_,(Expr)e2.impl_);
  }
  return (bool)uVar3;
}

Assistant:

bool VisitBinary(E e) {
    E binary = Cast<E>(expr_);
    return Equal(binary.lhs(), e.lhs()) && Equal(binary.rhs(), e.rhs());
  }